

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

HighsInt __thiscall
HighsDomain::ConflictSet::resolveDepth
          (ConflictSet *this,
          set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
          *frontier,HighsInt depthLevel,HighsInt stopSize,HighsInt minResolve,
          bool increaseConflictScore)

{
  int *piVar1;
  pointer ppVar2;
  double dVar3;
  HighsInt col;
  pointer p_Var4;
  HighsDomain *pHVar5;
  pointer piVar6;
  LocalDomChg *pLVar7;
  pointer pHVar8;
  bool bVar9;
  iterator iVar10;
  iterator domchg;
  iterator iVar11;
  int iVar12;
  LocalDomChg *i;
  LocalDomChg *__v;
  long lVar13;
  HighsPseudocost *this_00;
  int iVar14;
  int iVar15;
  HighsInt HVar16;
  _Base_ptr p_Var17;
  pair<std::_Rb_tree_iterator<HighsDomain::ConflictSet::LocalDomChg>,_bool> pVar18;
  LocalDomChg startPos;
  key_type local_48;
  
  p_Var4 = (this->resolveQueue).
           super__Vector_base<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->resolveQueue).
      super__Vector_base<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != p_Var4) {
    (this->resolveQueue).
    super__Vector_base<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = p_Var4;
  }
  pHVar5 = this->localdom;
  piVar6 = (pHVar5->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (depthLevel == 0) {
    lVar13 = 0;
    startPos.pos = 0;
  }
  else {
    lVar13 = (long)depthLevel;
    startPos.pos = piVar6[lVar13 + -1] + 1;
  }
  startPos.domchg.boundval = 0.0;
  startPos.domchg.column = 0;
  startPos.domchg.boundtype = kLower;
  iVar12 = (int)((ulong)((long)(pHVar5->branchPos_).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)piVar6) >> 2);
  if (depthLevel <= iVar12) {
    depthLevel = iVar12;
  }
  iVar14 = (int)lVar13 + -1;
  while (iVar15 = depthLevel, lVar13 < iVar12) {
    piVar1 = piVar6 + lVar13;
    dVar3 = (pHVar5->domchgstack_).
            super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
            super__Vector_impl_data._M_start[*piVar1].boundval;
    lVar13 = lVar13 + 1;
    iVar14 = iVar14 + 1;
    ppVar2 = (pHVar5->prevboundval_).
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start + *piVar1;
    iVar15 = iVar14;
    if ((dVar3 != ppVar2->first) || (NAN(dVar3) || NAN(ppVar2->first))) break;
  }
  if (iVar15 == iVar12) {
    iVar10._M_node = &(frontier->_M_t)._M_impl.super__Rb_tree_header._M_header;
  }
  else {
    local_48.pos = piVar6[iVar15];
    local_48.domchg.boundval = 0.0;
    local_48.domchg.column = 0;
    local_48.domchg.boundtype = kLower;
    iVar10 = std::
             _Rb_tree<HighsDomain::ConflictSet::LocalDomChg,_HighsDomain::ConflictSet::LocalDomChg,_std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
             ::upper_bound(&frontier->_M_t,&local_48);
  }
  domchg = std::
           _Rb_tree<HighsDomain::ConflictSet::LocalDomChg,_HighsDomain::ConflictSet::LocalDomChg,_std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
           ::lower_bound(&frontier->_M_t,&startPos);
  bVar9 = true;
  while (domchg._M_node != iVar10._M_node) {
    if ((uint)(this->localdom->domchgreason_).
              super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
              super__Vector_impl_data._M_start[(int)domchg._M_node[1]._M_color].type < 0xfffffffe) {
      pushQueue(this,(iterator)domchg._M_node);
    }
    domchg._M_node = (_Base_ptr)std::_Rb_tree_increment(domchg._M_node);
    bVar9 = false;
  }
  if (bVar9) {
    HVar16 = -1;
  }
  else {
    HVar16 = 0;
    while( true ) {
      iVar12 = (int)((ulong)((long)(this->resolveQueue).
                                   super__Vector_base<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->resolveQueue).
                                  super__Vector_base<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<std::_Rb_tree_const_iterator<HighsDomain::ConflictSet::LocalDomChg>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
      if ((iVar12 <= stopSize) && (iVar12 < 1 || minResolve <= HVar16)) break;
      iVar11 = popQueue(this);
      bVar9 = explainBoundChange(this,frontier,*(LocalDomChg *)(iVar11._M_node + 1));
      if (bVar9) {
        std::
        _Rb_tree<HighsDomain::ConflictSet::LocalDomChg,HighsDomain::ConflictSet::LocalDomChg,std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,std::less<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>
        ::erase_abi_cxx11_((_Rb_tree<HighsDomain::ConflictSet::LocalDomChg,HighsDomain::ConflictSet::LocalDomChg,std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,std::less<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>
                            *)frontier,(const_iterator)iVar11._M_node);
        pLVar7 = (this->resolvedDomainChanges).
                 super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (__v = (this->resolvedDomainChanges).
                   super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                   ._M_impl.super__Vector_impl_data._M_start; __v != pLVar7; __v = __v + 1) {
          pVar18 = std::
                   _Rb_tree<HighsDomain::ConflictSet::LocalDomChg,HighsDomain::ConflictSet::LocalDomChg,std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,std::less<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>
                   ::_M_insert_unique<HighsDomain::ConflictSet::LocalDomChg_const&>
                             ((_Rb_tree<HighsDomain::ConflictSet::LocalDomChg,HighsDomain::ConflictSet::LocalDomChg,std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,std::less<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>
                               *)frontier,__v);
          iVar11._M_node = (_Base_ptr)pVar18.first._M_node;
          if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            if ((__v->domchg).boundtype == kLower) {
              p_Var17 = (_Base_ptr)(__v->domchg).boundval;
              if ((double)p_Var17 <= (double)iVar11._M_node[1]._M_parent) {
                p_Var17 = iVar11._M_node[1]._M_parent;
              }
            }
            else {
              p_Var17 = (_Base_ptr)(__v->domchg).boundval;
              if ((double)iVar11._M_node[1]._M_parent <= (double)p_Var17) {
                p_Var17 = iVar11._M_node[1]._M_parent;
              }
            }
            iVar11._M_node[1]._M_parent = p_Var17;
          }
          else {
            if (increaseConflictScore) {
              pHVar8 = (this->localdom->domchgstack_).
                       super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              this_00 = &((this->localdom->mipsolver->mipdata_)._M_t.
                          super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                          .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                         pseudocost;
              col = pHVar8[__v->pos].column;
              if (pHVar8[__v->pos].boundtype == kLower) {
                HighsPseudocost::increaseConflictScoreUp(this_00,col);
              }
              else {
                HighsPseudocost::increaseConflictScoreDown(this_00,col);
              }
            }
            if ((startPos.pos <= __v->pos) &&
               ((uint)(this->localdom->domchgreason_).
                      super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>.
                      _M_impl.super__Vector_impl_data._M_start[__v->pos].type < 0xfffffffe)) {
              pushQueue(this,iVar11);
            }
          }
        }
        HVar16 = HVar16 + 1;
      }
    }
  }
  return HVar16;
}

Assistant:

HighsInt HighsDomain::ConflictSet::resolveDepth(std::set<LocalDomChg>& frontier,
                                                HighsInt depthLevel,
                                                HighsInt stopSize,
                                                HighsInt minResolve,
                                                bool increaseConflictScore) {
  clearQueue();
  LocalDomChg startPos =
      LocalDomChg{depthLevel == 0 ? 0 : localdom.branchPos_[depthLevel - 1] + 1,
                  HighsDomainChange()};
  while (depthLevel < (HighsInt)localdom.branchPos_.size()) {
    HighsInt branchPos = localdom.branchPos_[depthLevel];
    if (localdom.domchgstack_[branchPos].boundval !=
        localdom.prevboundval_[branchPos].first)
      break;
    // printf("skipping redundant depth\n");
    ++depthLevel;
  }

  auto iterEnd =
      depthLevel == (HighsInt)localdom.branchPos_.size()
          ? frontier.end()
          : frontier.upper_bound(LocalDomChg{localdom.branchPos_[depthLevel],
                                             HighsDomainChange()});
  bool empty = true;
  for (auto it = frontier.lower_bound(startPos); it != iterEnd; ++it) {
    assert(it != frontier.end());
    empty = false;
    if (resolvable(it->pos)) pushQueue(it);
  }

  if (empty) return -1;

  HighsInt numResolved = 0;

  while (queueSize() > stopSize ||
         (queueSize() > 0 && numResolved < minResolve)) {
    std::set<LocalDomChg>::iterator pos = popQueue();
    if (!explainBoundChange(frontier, *pos)) continue;

    ++numResolved;
    frontier.erase(pos);
    for (const LocalDomChg& i : resolvedDomainChanges) {
      auto insertResult = frontier.insert(i);
      if (insertResult.second) {
        if (increaseConflictScore) {
          if (localdom.domchgstack_[i.pos].boundtype == HighsBoundType::kLower)
            localdom.mipsolver->mipdata_->pseudocost.increaseConflictScoreUp(
                localdom.domchgstack_[i.pos].column);
          else
            localdom.mipsolver->mipdata_->pseudocost.increaseConflictScoreDown(
                localdom.domchgstack_[i.pos].column);
        }
        if (i.pos >= startPos.pos && resolvable(i.pos))
          pushQueue(insertResult.first);
      } else {
        if (i.domchg.boundtype == HighsBoundType::kLower) {
          // if (insertResult.first->domchg.boundval != i.domchg.boundval)
          //  printf(
          //      "got different relaxed lower bounds: current=%g, new=%g, "
          //      "stack=%g\n",
          //      insertResult.first->domchg.boundval, i.domchg.boundval,
          //      localdom.domchgstack_[i.pos].boundval);
          //
          insertResult.first->domchg.boundval =
              std::max(insertResult.first->domchg.boundval, i.domchg.boundval);
        } else {
          // if (insertResult.first->domchg.boundval != i.domchg.boundval)
          //   printf(
          //       "got different relaxed upper bounds: current=%g, new=%g, "
          //       "stack=%g\n",
          //       insertResult.first->domchg.boundval, i.domchg.boundval,
          //       localdom.domchgstack_[i.pos].boundval);
          insertResult.first->domchg.boundval =
              std::min(insertResult.first->domchg.boundval, i.domchg.boundval);
        }
      }
    }
  }

  return numResolved;
}